

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndGroup(void)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiGroupData *bb;
  float fVar3;
  ImVec2 size;
  ImVec2 IVar4;
  ImRect group_bb;
  ImGuiGroupData *group_data;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *this;
  ImVec2 *in_stack_ffffffffffffffc0;
  ImVec2 *in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  
  pIVar1 = GImGui;
  pIVar2 = GetCurrentWindow();
  bb = ImVector<ImGuiGroupData>::back(&(pIVar2->DC).GroupStack);
  this = (ImRect *)&stack0xffffffffffffffd8;
  ImRect::ImRect(this,&bb->BackupCursorPos,&(pIVar2->DC).CursorMaxPos);
  size = ImMax(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  (pIVar2->DC).CursorPos = bb->BackupCursorPos;
  IVar4 = ImMax(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  (pIVar2->DC).CursorMaxPos = IVar4;
  (pIVar2->DC).Indent.x = (bb->BackupIndent).x;
  (pIVar2->DC).GroupOffset.x = (bb->BackupGroupOffset).x;
  (pIVar2->DC).CurrentLineSize = bb->BackupCurrentLineSize;
  (pIVar2->DC).CurrentLineTextBaseOffset = bb->BackupCurrentLineTextBaseOffset;
  (pIVar2->DC).LogLinePosY = (pIVar2->DC).CursorPos.y - 9999.0;
  if ((bb->AdvanceCursor & 1U) != 0) {
    fVar3 = ImMax<float>((pIVar2->DC).PrevLineTextBaseOffset,bb->BackupCurrentLineTextBaseOffset);
    (pIVar2->DC).CurrentLineTextBaseOffset = fVar3;
    ImRect::GetSize(this);
    ItemSize((ImVec2 *)size,in_stack_ffffffffffffffdc);
    ItemAdd((ImRect *)bb,(ImGuiID)size.y,
            (ImRect *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  if (((bb->BackupActiveIdIsAlive == pIVar1->ActiveId) ||
      (pIVar1->ActiveIdIsAlive != pIVar1->ActiveId)) || (pIVar1->ActiveId == 0)) {
    if (((bb->BackupActiveIdPreviousFrameIsAlive & 1U) == 0) &&
       ((pIVar1->ActiveIdPreviousFrameIsAlive & 1U) != 0)) {
      (pIVar2->DC).LastItemId = pIVar1->ActiveIdPreviousFrame;
    }
  }
  else {
    (pIVar2->DC).LastItemId = pIVar1->ActiveId;
  }
  IVar4.y = in_stack_ffffffffffffffdc;
  IVar4.x = in_stack_ffffffffffffffd8;
  (pIVar2->DC).LastItemRect.Min = IVar4;
  (pIVar2->DC).LastItemRect.Max = size;
  ImVector<ImGuiGroupData>::pop_back(&(pIVar2->DC).GroupStack);
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(!window->DC.GroupStack.empty());    // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, window->DC.CursorMaxPos);
    group_bb.Max = ImMax(group_bb.Min, group_bb.Max);

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrentLineSize = group_data.BackupCurrentLineSize;
    window->DC.CurrentLineTextBaseOffset = group_data.BackupCurrentLineTextBaseOffset;
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f; // To enforce Log carriage return

    if (group_data.AdvanceCursor)
    {
        window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrentLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
        ItemSize(group_bb.GetSize(), group_data.BackupCurrentLineTextBaseOffset);
        ItemAdd(group_bb, 0);
    }

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // (and if you grep for LastItemId you'll notice it is only used in that context.
    if ((group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId) // && g.ActiveIdWindow->RootWindow == window->RootWindow)
        window->DC.LastItemId = g.ActiveId;
    else if (!group_data.BackupActiveIdPreviousFrameIsAlive && g.ActiveIdPreviousFrameIsAlive) // && g.ActiveIdPreviousFrameWindow->RootWindow == window->RootWindow)
        window->DC.LastItemId = g.ActiveIdPreviousFrame;
    window->DC.LastItemRect = group_bb;

    window->DC.GroupStack.pop_back();

    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}